

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigJust.c
# Opt level: O1

int Aig_ObjFindSatAssign(Aig_Man_t *pAig,Aig_Obj_t *pNode,int Value,Vec_Int_t *vSuppLits)

{
  int iVar1;
  int Heur;
  
  for (; (*(uint *)&pNode->field_0x18 & 7) == 3;
      pNode = (Aig_Obj_t *)((ulong)pNode->pFanin0 & 0xfffffffffffffffe)) {
    Value = (uint)pNode->pFanin0 & 1 ^ Value;
  }
  Heur = 0;
  do {
    vSuppLits->nSize = 0;
    Aig_ManIncrementTravId(pAig);
    iVar1 = Aig_NtkFindSatAssign_rec(pAig,pNode,Value,vSuppLits,Heur);
    if (iVar1 != 0) {
      return 1;
    }
    Heur = Heur + 1;
  } while (Heur != 8);
  return 0;
}

Assistant:

int Aig_ObjFindSatAssign( Aig_Man_t * pAig, Aig_Obj_t * pNode, int Value, Vec_Int_t * vSuppLits )
{
    int i;
    if ( Aig_ObjIsCo(pNode) )
        return Aig_ObjFindSatAssign( pAig, Aig_ObjFanin0(pNode), Value ^ Aig_ObjFaninC0(pNode), vSuppLits );
    for ( i = 0; i < 8; i++ )
    {
        Vec_IntClear( vSuppLits );
        Aig_ManIncrementTravId( pAig );
        if ( Aig_NtkFindSatAssign_rec( pAig, pNode, Value, vSuppLits, i ) )
            return 1;
    }
    return 0;
}